

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
CFG::findVariables(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *__return_storage_ptr__,CFG *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *productionTo)

{
  pointer ppPVar1;
  Production *__args;
  bool bVar2;
  pointer ppPVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppPVar1 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar3 = (this->productionsP).
                 super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar3 != ppPVar1; ppPVar3 = ppPVar3 + 1) {
    __args = *ppPVar3;
    bVar2 = std::operator==(&__args->toP,productionTo);
    if (bVar2) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string_const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 __return_storage_ptr__,&__args->fromP);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> CFG::findVariables(std::vector<std::string> productionTo) {
    std::vector<std::string> variables = {};
    for (Production *production: productionsP) {
        if (production->getToP() == productionTo) {
            variables.emplace_back(production->getFromP());
        }
    }
    return variables;
}